

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c382::TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
          (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ktx_uint8_t *__s2;
  ulong uVar15;
  uint uVar16;
  size_t __n;
  long lVar17;
  ktx_uint8_t *pImage;
  void *__s1;
  uint uVar18;
  
  pvVar3 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).images.
                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
  uVar1 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).width;
  uVar2 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).height;
  for (uVar12 = 0; uVar13 = (ulong)uVar12, uVar13 < uVar10; uVar12 = uVar12 + 1) {
    uVar8 = uVar1 >> ((byte)uVar12 & 0x1f);
    __n = (ulong)uVar8 * 3;
    if (uVar8 == 0) {
      __n = 3;
    }
    uVar8 = uVar2 >> ((byte)uVar12 & 0x1f);
    uVar11 = (ulong)(uVar8 + (uVar8 == 0));
    uVar8 = (int)__n - 1U & 3;
    lVar17 = (uVar8 ^ 3) + __n;
    pvVar4 = *(pointer *)
              ((long)&(pvVar3->
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data + 8);
    lVar5 = *(long *)&(pvVar3->
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data;
    for (uVar16 = 0; (ulong)uVar16 < (ulong)(((long)pvVar4 - lVar5) / 0x18); uVar16 = uVar16 + 1) {
      lVar6 = *(long *)&pvVar3[uVar13].
                        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        ._M_impl;
      lVar14 = (ulong)uVar16 * 0x18;
      lVar7 = *(long *)(lVar6 + lVar14);
      lVar6 = *(long *)(lVar6 + 8 + lVar14);
      for (uVar18 = 0; (ulong)uVar18 < (ulong)((lVar6 - lVar7) / 0x18); uVar18 = uVar18 + 1) {
        lVar14 = (ulong)uVar18 * 0x18;
        __s1 = *(void **)(lVar7 + lVar14);
        __s2 = pData;
        uVar15 = uVar11;
        if (uVar8 == 3) {
          iVar9 = bcmp(__s1,pData,*(long *)(lVar14 + lVar7 + 8) - (long)__s1);
          if (iVar9 != 0) goto LAB_0012a322;
        }
        else {
          while ((int)uVar15 != 0) {
            iVar9 = bcmp(__s1,__s2,__n);
            if (iVar9 != 0) goto LAB_0012a322;
            __s1 = (void *)((long)__s1 + __n);
            __s2 = __s2 + lVar17;
            uVar15 = (ulong)((int)uVar15 - 1);
          }
        }
        pData = pData + uVar11 * lVar17;
      }
    }
  }
LAB_0012a322:
  return uVar10 <= uVar13;
}

Assistant:

bool
    compareTexture1Images(ktx_uint8_t* pData)
    {
        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_size_t rowBytes = levelWidth * sizeof(component_type) * numComponents;
            ktx_uint32_t rowPadding = ROUNDING(rowBytes);
            ktx_size_t paddedImageBytes = (rowBytes + rowPadding) * levelHeight;
            for (ktx_uint32_t layer = 0; layer < images[0].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(), pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += rowBytes + rowPadding;
                        }
                    }
                }
            }
        }
        return true;
    }